

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

bool __thiscall ON_3dVector::IsNotZero(ON_3dVector *this)

{
  bool local_19;
  ON_3dVector *this_local;
  
  if (((((this->x == 0.0) && (!NAN(this->x))) && (this->y == 0.0)) &&
      ((!NAN(this->y) && (this->z == 0.0)))) && (!NAN(this->z))) {
    return false;
  }
  local_19 = false;
  if (((-1.23432101234321e+308 < this->x) &&
      (local_19 = false, this->x <= 1.23432101234321e+308 && this->x != 1.23432101234321e+308)) &&
     ((local_19 = false, -1.23432101234321e+308 < this->y &&
      ((local_19 = false, this->y <= 1.23432101234321e+308 && this->y != 1.23432101234321e+308 &&
       (local_19 = false, -1.23432101234321e+308 < this->z)))))) {
    local_19 = this->z <= 1.23432101234321e+308 && this->z != 1.23432101234321e+308;
  }
  return local_19;
}

Assistant:

bool ON_3dVector::IsNotZero() const
{
  // the UNSET tests also insure x, y, and z are not nans.
  return
    (x != 0.0 || y != 0.0 || z != 0.0)
    && x > ON_UNSET_VALUE && x < ON_UNSET_POSITIVE_VALUE
    && y > ON_UNSET_VALUE && y < ON_UNSET_POSITIVE_VALUE
    && z > ON_UNSET_VALUE && z < ON_UNSET_POSITIVE_VALUE
    ;
}